

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O1

void __thiscall txrequest_tests::TxRequestTest::test_method(TxRequestTest *this)

{
  FastRandomContext *__urng;
  __uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_> *p_Var1;
  char *pcVar2;
  undefined8 *puVar3;
  long lVar4;
  size_type sVar5;
  _Manager_type p_Var6;
  _Invoker_type p_Var7;
  uint uVar8;
  __uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_> _Var9;
  _Invoker_type p_Var10;
  undefined8 uVar11;
  pointer pfVar12;
  pointer ppVar13;
  pointer ppVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer pfVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  result_type_conflict rVar19;
  ulong uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  long lVar25;
  undefined8 uVar26;
  _Tp_alloc_type *p_Var27;
  _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
  *p_Var28;
  int iVar29;
  _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
  *p_Var30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RSI;
  iterator in_R8;
  iterator pvVar31;
  iterator in_R9;
  iterator pvVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  ulong uVar33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  char *pcVar36;
  long in_FS_OFFSET;
  bool bVar37;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar38;
  int local_204;
  size_t *local_1e8;
  char *local_1e0;
  undefined4 local_1d4;
  size_t local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
  local_188;
  undefined4 *local_170;
  assertion_result local_168;
  undefined4 **local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  element_type *local_130;
  shared_count sStack_128;
  __distr_type __d;
  microseconds local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  Runner runner;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  __urng = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_rng;
  iVar29 = 0;
  do {
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    pcVar36 = (char *)0x0;
    paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    local_204 = 0;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__urng;
    do {
      if (paVar34 == paVar35) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar34 - (long)pcVar36);
        if (paVar18 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x7fffffffffffffe0) goto LAB_006b44af;
        uVar33 = (long)paVar18 >> 5;
        uVar20 = 1;
        if (paVar34 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar36) {
          uVar20 = uVar33;
        }
        p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar20 + uVar33);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        p_Var27 = (_Tp_alloc_type *)(uVar20 + uVar33);
        p_Var30 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)0x3ffffffffffffff;
        if (!CARRY8(uVar20,uVar33)) {
          p_Var30 = p_Var28;
        }
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_M_allocate(p_Var30,(size_t)in_RSI);
        pcVar2 = (char *)((long)(paVar15 + 1) + (long)paVar18);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2[8] = '\0';
        pcVar2[9] = '\0';
        pcVar2[10] = '\0';
        pcVar2[0xb] = '\0';
        pcVar2[0xc] = '\0';
        pcVar2[0xd] = '\0';
        pcVar2[0xe] = '\0';
        pcVar2[0xf] = '\0';
        *(TxRequestTest **)((long)paVar15 + (long)paVar18) = this;
        *(int *)(paVar15->_M_local_buf + 8 + (long)paVar18) = local_204;
        *(code **)((char *)((long)paVar15 + 0x18) + (long)paVar18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_invoke;
        *(code **)((long)(paVar15 + 1) + (long)paVar18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_manager;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_S_relocate((pointer)pcVar36,(pointer)paVar34,(pointer)paVar15,p_Var27);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar36 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar35 - (long)pcVar36);
          operator_delete(pcVar36,(ulong)paVar34);
        }
        unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)p_Var30 * 0x20);
        paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(unaff_R12->_M_local_buf + (long)paVar15);
        in_RSI = paVar34;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar15;
      }
      else {
        paVar34->_M_allocated_capacity = 0;
        *(char *)((long)paVar34 + 8) = '\0';
        *(char *)((long)paVar34 + 9) = '\0';
        *(char *)((long)paVar34 + 10) = '\0';
        *(char *)((long)paVar34 + 0xb) = '\0';
        *(char *)((long)paVar34 + 0xc) = '\0';
        *(char *)((long)paVar34 + 0xd) = '\0';
        *(char *)((long)paVar34 + 0xe) = '\0';
        *(char *)((long)paVar34 + 0xf) = '\0';
        paVar34[1]._M_allocated_capacity = 0;
        pcVar2 = (char *)((long)paVar34 + 0x18);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        paVar34->_M_allocated_capacity = (size_type)this;
        *(int *)(paVar34->_M_local_buf + 8) = local_204;
        *(code **)((long)paVar34 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_invoke;
        paVar34[1]._M_allocated_capacity =
             (size_type)
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:705:31)>
             ::_M_manager;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar36;
        paVar16 = paVar34;
      }
      pcVar36 = (char *)(paVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar36 == paVar35) {
        lVar25 = (long)pcVar36 - (long)paVar15;
        if (lVar25 == 0x7fffffffffffffe0) goto LAB_006b44e2;
        uVar33 = lVar25 >> 5;
        uVar20 = 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar36 != paVar15) {
          uVar20 = uVar33;
        }
        p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar20 + uVar33);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        p_Var27 = (_Tp_alloc_type *)(uVar20 + uVar33);
        p_Var30 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)0x3ffffffffffffff;
        if (!CARRY8(uVar20,uVar33)) {
          p_Var30 = p_Var28;
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_M_allocate(p_Var30,(size_t)in_RSI);
        puVar3 = (undefined8 *)((long)paVar18 + lVar25 + 0x10);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(TxRequestTest **)((long)paVar18 + lVar25) = this;
        *(int *)((long)paVar18 + lVar25 + 8) = local_204;
        *(code **)((long)paVar18 + lVar25 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_invoke;
        *(code **)((long)paVar18 + lVar25 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_manager;
        in_RSI = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar36;
        pfVar17 = _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)paVar15,(pointer)pcVar36,(pointer)paVar18,p_Var27);
        if (paVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          in_RSI = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)paVar35 - (long)paVar15);
          operator_delete(paVar15,(ulong)in_RSI);
        }
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pfVar17 + 1);
        paVar35 = paVar18 + (long)p_Var30 * 2;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar18;
      }
      else {
        paVar16[3]._M_allocated_capacity = 0;
        pcVar2 = (char *)((long)paVar16 + 0x38);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        *(size_type *)pcVar36 = 0;
        pcVar2 = (char *)((long)paVar16 + 0x28);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        paVar16[2]._M_allocated_capacity = (size_type)this;
        *(int *)((long)paVar16 + 0x28) = local_204;
        *(code **)((long)paVar16 + 0x38) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_invoke;
        paVar16[3]._M_allocated_capacity =
             (size_type)
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:706:31)>
             ::_M_manager;
        paVar34 = paVar16 + 4;
        paVar18 = paVar15;
      }
      if (paVar34 == paVar35) {
        unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar34 - (long)paVar18);
        if (unaff_R12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x7fffffffffffffe0) goto LAB_006b4449;
        uVar33 = (long)unaff_R12 >> 5;
        uVar20 = 1;
        if (paVar34 != paVar18) {
          uVar20 = uVar33;
        }
        p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar20 + uVar33);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        p_Var27 = (_Tp_alloc_type *)(uVar20 + uVar33);
        p_Var30 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)0x3ffffffffffffff;
        if (!CARRY8(uVar20,uVar33)) {
          p_Var30 = p_Var28;
        }
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_M_allocate(p_Var30,(size_t)in_RSI);
        pcVar36 = (char *)((long)(paVar15 + 1) + (long)unaff_R12);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        pcVar36[8] = '\0';
        pcVar36[9] = '\0';
        pcVar36[10] = '\0';
        pcVar36[0xb] = '\0';
        pcVar36[0xc] = '\0';
        pcVar36[0xd] = '\0';
        pcVar36[0xe] = '\0';
        pcVar36[0xf] = '\0';
        *(TxRequestTest **)((long)paVar15 + (long)unaff_R12) = this;
        *(int *)(paVar15->_M_local_buf + 8 + (long)unaff_R12) = local_204;
        *(code **)((char *)((long)paVar15 + 0x18) + (long)unaff_R12) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_invoke;
        *(code **)((long)(paVar15 + 1) + (long)unaff_R12) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_manager;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_S_relocate((pointer)paVar18,(pointer)paVar34,(pointer)paVar15,p_Var27);
        if (paVar18 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar35 - (long)paVar18);
          operator_delete(paVar18,(ulong)paVar34);
        }
        pcVar36 = (char *)((long)p_Var30 * 0x20);
        paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar36 + (long)paVar15);
        __n = paVar34;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar15;
      }
      else {
        paVar34->_M_allocated_capacity = 0;
        *(char *)((long)paVar34 + 8) = '\0';
        *(char *)((long)paVar34 + 9) = '\0';
        *(char *)((long)paVar34 + 10) = '\0';
        *(char *)((long)paVar34 + 0xb) = '\0';
        *(char *)((long)paVar34 + 0xc) = '\0';
        *(char *)((long)paVar34 + 0xd) = '\0';
        *(char *)((long)paVar34 + 0xe) = '\0';
        *(char *)((long)paVar34 + 0xf) = '\0';
        paVar34[1]._M_allocated_capacity = 0;
        pcVar2 = (char *)((long)paVar34 + 0x18);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        paVar34->_M_allocated_capacity = (size_type)this;
        *(int *)(paVar34->_M_local_buf + 8) = local_204;
        *(code **)((long)paVar34 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_invoke;
        paVar34[1]._M_allocated_capacity =
             (size_type)
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:707:31)>
             ::_M_manager;
        paVar15 = paVar18;
        __n = in_RSI;
        paVar16 = paVar34;
      }
      unaff_R12 = paVar16 + 2;
      if (unaff_R12 == paVar35) {
        lVar25 = (long)unaff_R12 - (long)paVar15;
        in_RSI = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar36;
        if (lVar25 == 0x7fffffffffffffe0) goto LAB_006b4515;
        uVar33 = lVar25 >> 5;
        uVar20 = 1;
        if (unaff_R12 != paVar15) {
          uVar20 = uVar33;
        }
        p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar20 + uVar33);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        p_Var27 = (_Tp_alloc_type *)(uVar20 + uVar33);
        p_Var30 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)0x3ffffffffffffff;
        if (!CARRY8(uVar20,uVar33)) {
          p_Var30 = p_Var28;
        }
        pcVar36 = (char *)_GLOBAL__N_1::std::
                          _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                          ::_M_allocate(p_Var30,(size_t)__n);
        puVar3 = (undefined8 *)((long)pcVar36 + lVar25 + 0x10);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(TxRequestTest **)((long)pcVar36 + lVar25) = this;
        *(int *)((long)pcVar36 + lVar25 + 8) = local_204;
        *(code **)((long)pcVar36 + lVar25 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_invoke;
        *(code **)((long)pcVar36 + lVar25 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_manager;
        __n = unaff_R12;
        pfVar17 = _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)paVar15,(pointer)unaff_R12,(pointer)pcVar36,p_Var27);
        if (paVar15 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar35 - (long)paVar15);
          operator_delete(paVar15,(ulong)__n);
        }
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pfVar17 + 1);
        paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pcVar36 + (long)p_Var30 * 2 * 0x10);
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar36;
      }
      else {
        paVar16[3]._M_allocated_capacity = 0;
        pcVar36 = (char *)((long)paVar16 + 0x38);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        unaff_R12->_M_allocated_capacity = 0;
        pcVar36 = (char *)((long)paVar16 + 0x28);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        paVar16[2]._M_allocated_capacity = (size_type)this;
        *(int *)((long)paVar16 + 0x28) = local_204;
        *(code **)((long)paVar16 + 0x38) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_invoke;
        paVar16[3]._M_allocated_capacity =
             (size_type)
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:708:31)>
             ::_M_manager;
        paVar34 = paVar16 + 4;
        pcVar36 = (char *)paVar15;
      }
      if (paVar34 == paVar35) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar34 - (long)pcVar36);
        if (paVar18 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x7fffffffffffffe0) goto LAB_006b447c;
        uVar33 = (long)paVar18 >> 5;
        uVar20 = 1;
        if (paVar34 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar36) {
          uVar20 = uVar33;
        }
        p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar20 + uVar33);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        p_Var27 = (_Tp_alloc_type *)(uVar20 + uVar33);
        p_Var30 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)0x3ffffffffffffff;
        if (!CARRY8(uVar20,uVar33)) {
          p_Var30 = p_Var28;
        }
        unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_GLOBAL__N_1::std::
                       _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                       ::_M_allocate(p_Var30,(size_t)__n);
        pcVar2 = (char *)((long)(unaff_R12 + 1) + (long)paVar18);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        pcVar2[8] = '\0';
        pcVar2[9] = '\0';
        pcVar2[10] = '\0';
        pcVar2[0xb] = '\0';
        pcVar2[0xc] = '\0';
        pcVar2[0xd] = '\0';
        pcVar2[0xe] = '\0';
        pcVar2[0xf] = '\0';
        *(TxRequestTest **)((long)unaff_R12 + (long)paVar18) = this;
        *(int *)(unaff_R12->_M_local_buf + 8 + (long)paVar18) = local_204;
        *(code **)((char *)((long)unaff_R12 + 0x18) + (long)paVar18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_invoke;
        *(code **)((long)(unaff_R12 + 1) + (long)paVar18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_manager;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_S_relocate((pointer)pcVar36,(pointer)paVar34,(pointer)unaff_R12,p_Var27);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar36 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar35 - (long)pcVar36);
          operator_delete(pcVar36,(ulong)paVar34);
        }
        paVar35 = unaff_R12 + (long)p_Var30 * 2;
        __n = paVar34;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)unaff_R12;
      }
      else {
        paVar34->_M_allocated_capacity = 0;
        *(char *)((long)paVar34 + 8) = '\0';
        *(char *)((long)paVar34 + 9) = '\0';
        *(char *)((long)paVar34 + 10) = '\0';
        *(char *)((long)paVar34 + 0xb) = '\0';
        *(char *)((long)paVar34 + 0xc) = '\0';
        *(char *)((long)paVar34 + 0xd) = '\0';
        *(char *)((long)paVar34 + 0xe) = '\0';
        *(char *)((long)paVar34 + 0xf) = '\0';
        paVar34[1]._M_allocated_capacity = 0;
        pcVar2 = (char *)((long)paVar34 + 0x18);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        paVar34->_M_allocated_capacity = (size_type)this;
        *(int *)(paVar34->_M_local_buf + 8) = local_204;
        *(code **)((long)paVar34 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_invoke;
        paVar34[1]._M_allocated_capacity =
             (size_type)
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:709:31)>
             ::_M_manager;
        unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar36;
        paVar18 = paVar34;
      }
      in_RSI = paVar18 + 2;
      if (in_RSI == paVar35) {
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)in_RSI - (long)unaff_R12);
        if (paVar18 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x7fffffffffffffe0) goto LAB_006b4548;
        uVar33 = (long)paVar18 >> 5;
        uVar20 = 1;
        if (in_RSI != unaff_R12) {
          uVar20 = uVar33;
        }
        p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar20 + uVar33);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        p_Var27 = (_Tp_alloc_type *)(uVar20 + uVar33);
        p_Var30 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)0x3ffffffffffffff;
        if (!CARRY8(uVar20,uVar33)) {
          p_Var30 = p_Var28;
        }
        paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_M_allocate(p_Var30,(size_t)__n);
        pcVar36 = (char *)((long)paVar34 + (long)paVar18);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        pcVar36[8] = '\0';
        pcVar36[9] = '\0';
        pcVar36[10] = '\0';
        pcVar36[0xb] = '\0';
        pcVar36[0xc] = '\0';
        pcVar36[0xd] = '\0';
        pcVar36[0xe] = '\0';
        pcVar36[0xf] = '\0';
        pcVar36 = (char *)((long)(paVar34 + 1) + (long)paVar18);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        pcVar36[8] = '\0';
        pcVar36[9] = '\0';
        pcVar36[10] = '\0';
        pcVar36[0xb] = '\0';
        pcVar36[0xc] = '\0';
        pcVar36[0xd] = '\0';
        pcVar36[0xe] = '\0';
        pcVar36[0xf] = '\0';
        *(TxRequestTest **)((long)paVar34 + (long)paVar18) = this;
        *(code **)((char *)((long)paVar34 + 0x18) + (long)paVar18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_invoke;
        *(code **)((long)(paVar34 + 1) + (long)paVar18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_manager;
        pfVar17 = _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::_S_relocate((pointer)unaff_R12,(pointer)in_RSI,(pointer)paVar34,p_Var27);
        if (unaff_R12 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          in_RSI = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)paVar35 - (long)unaff_R12);
          operator_delete(unaff_R12,(ulong)in_RSI);
        }
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pfVar17 + 1);
        paVar35 = paVar34 + (long)p_Var30 * 2;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)paVar34;
      }
      else {
        paVar18[3]._M_allocated_capacity = 0;
        pcVar36 = (char *)((long)paVar18 + 0x38);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        in_RSI->_M_allocated_capacity = 0;
        pcVar36 = (char *)((long)paVar18 + 0x28);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        paVar18[2]._M_allocated_capacity = (size_type)this;
        *(code **)((long)paVar18 + 0x38) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_invoke;
        paVar18[3]._M_allocated_capacity =
             (size_type)
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:710:31)>
             ::_M_manager;
        paVar18 = paVar18 + 4;
        paVar34 = unaff_R12;
        in_RSI = __n;
      }
      if (paVar18 == paVar35) {
        lVar25 = (long)paVar18 - (long)paVar34;
        if (lVar25 == 0x7fffffffffffffe0) goto LAB_006b457b;
        uVar33 = lVar25 >> 5;
        uVar20 = 1;
        if (paVar18 != paVar34) {
          uVar20 = uVar33;
        }
        p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)(uVar20 + uVar33);
        if ((_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
             *)0x3fffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     *)0x3ffffffffffffff;
        }
        p_Var27 = (_Tp_alloc_type *)(uVar20 + uVar33);
        p_Var30 = (_Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   *)0x3ffffffffffffff;
        if (!CARRY8(uVar20,uVar33)) {
          p_Var30 = p_Var28;
        }
        pcVar36 = (char *)_GLOBAL__N_1::std::
                          _Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                          ::_M_allocate(p_Var30,(size_t)in_RSI);
        *(undefined8 *)((long)pcVar36 + lVar25) = 0;
        ((undefined8 *)((long)pcVar36 + lVar25))[1] = 0;
        puVar3 = (undefined8 *)((long)pcVar36 + lVar25 + 0x10);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(TxRequestTest **)((long)pcVar36 + lVar25) = this;
        *(code **)((long)pcVar36 + lVar25 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_invoke;
        *(code **)((long)pcVar36 + lVar25 + 0x10) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_manager;
        in_RSI = paVar18;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_GLOBAL__N_1::std::
                     vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                     ::_S_relocate((pointer)paVar34,(pointer)paVar18,(pointer)pcVar36,p_Var27);
        if (paVar34 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          in_RSI = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)paVar35 - (long)paVar34);
          operator_delete(paVar34,(ulong)in_RSI);
        }
        unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)p_Var30 * 0x20);
        paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(unaff_R12->_M_local_buf + (long)pcVar36);
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar36;
      }
      else {
        paVar18->_M_allocated_capacity = 0;
        *(char *)((long)paVar18 + 8) = '\0';
        *(char *)((long)paVar18 + 9) = '\0';
        *(char *)((long)paVar18 + 10) = '\0';
        *(char *)((long)paVar18 + 0xb) = '\0';
        *(char *)((long)paVar18 + 0xc) = '\0';
        *(char *)((long)paVar18 + 0xd) = '\0';
        *(char *)((long)paVar18 + 0xe) = '\0';
        *(char *)((long)paVar18 + 0xf) = '\0';
        paVar18[1]._M_allocated_capacity = 0;
        pcVar36 = (char *)((long)paVar18 + 0x18);
        pcVar36[0] = '\0';
        pcVar36[1] = '\0';
        pcVar36[2] = '\0';
        pcVar36[3] = '\0';
        pcVar36[4] = '\0';
        pcVar36[5] = '\0';
        pcVar36[6] = '\0';
        pcVar36[7] = '\0';
        paVar18->_M_allocated_capacity = (size_type)this;
        *(code **)((long)paVar18 + 0x18) =
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_invoke;
        paVar18[1]._M_allocated_capacity =
             (size_type)
             _GLOBAL__N_1::std::
             _Function_handler<void_((anonymous_namespace)::Scenario_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:711:31)>
             ::_M_manager;
        pcVar36 = (char *)paVar34;
      }
      pfVar12 = local_188.
                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar18->_M_local_buf + 0x20);
      local_204 = local_204 + 1;
    } while (local_204 != 0x40);
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar34;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.
           super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_start != paVar34) {
      if ((ulong)((long)paVar34->_M_local_buf -
                 (long)local_188.
                       super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x1fffffffe1) {
        pfVar17 = (pointer)((long)local_188.
                                  super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0x20);
        if (((long)paVar34->_M_local_buf -
             (long)local_188.
                   super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                   ._M_impl.super__Vector_impl_data._M_start & 0x20U) == 0) {
          __d._M_param._M_a = 0;
          __d._M_param._M_b = 1;
          rVar19 = std::uniform_int_distribution<unsigned_long>::operator()
                             ((uniform_int_distribution<unsigned_long> *)&__d,__urng,
                              (param_type *)&__d);
          runner.txrequest.m_impl._M_t.
          super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
          ._M_t.
          super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
          .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
               *(unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_> *)
                &(pfVar17->super__Function_base)._M_functor;
          runner.actions.
          super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = *(pointer *)((long)pfVar12 + 0x28);
          uVar26 = *(undefined8 *)
                    (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_local_buf + 8);
          *(size_type *)&(pfVar17->super__Function_base)._M_functor =
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_allocated_capacity;
          *(undefined8 *)((long)pfVar12 + 0x28) = uVar26;
          pfVar17 = (pointer)((long)pfVar12 + 0x40);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_allocated_capacity =
               (size_type)
               runner.txrequest.m_impl._M_t.
               super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
               .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl;
          *(pointer *)
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_local_buf + 8) =
               runner.actions.
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          p_Var6 = *(_Manager_type *)((long)pfVar12 + 0x30);
          p_Var7 = *(_Invoker_type *)((long)pfVar12 + 0x38);
          p_Var10 = (_Invoker_type)
                    (&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)pfVar12 + (rVar19 * 2 + 1) * 0x10))->_M_allocated_capacity)[1];
          *(_Manager_type *)((long)pfVar12 + 0x30) =
               (_Manager_type)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)pfVar12 + (rVar19 * 2 + 1) * 0x10))->_M_allocated_capacity;
          *(_Invoker_type *)((long)pfVar12 + 0x38) = p_Var10;
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)pfVar12 + (rVar19 * 2 + 1) * 0x10))->_M_allocated_capacity = (size_type)p_Var6;
          (&((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + (rVar19 * 2 + 1) * 0x10))->_M_allocated_capacity)[1] =
               (size_type)p_Var7;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pfVar17 != paVar34) {
          lVar25 = (long)pfVar17 - (long)pfVar12;
          do {
            uVar33 = (lVar25 >> 5) + 2;
            runner.actions.
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)(((lVar25 >> 5) + 1) * uVar33 + -1)
            ;
            runner.txrequest.m_impl._M_t.
            super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
            .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
                 (unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>)
                 (__uniq_ptr_data<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>,_true,_true>
                  )0x0;
            rVar19 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&runner,__urng,
                                (param_type *)&runner);
            uVar20 = rVar19 / uVar33;
            uVar33 = rVar19 % uVar33;
            sVar5 = *(size_type *)&(pfVar17->super__Function_base)._M_functor;
            uVar26 = *(undefined8 *)((long)&(pfVar17->super__Function_base)._M_functor + 8);
            uVar11 = *(undefined8 *)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)pfVar12 + uVar20 * 2 * 0x10))->_M_local_buf + 8);
            *(size_type *)&(pfVar17->super__Function_base)._M_functor =
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pfVar12 + uVar20 * 2 * 0x10))->_M_allocated_capacity;
            *(undefined8 *)((long)&(pfVar17->super__Function_base)._M_functor + 8) = uVar11;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + uVar20 * 2 * 0x10))->_M_allocated_capacity = sVar5;
            *(undefined8 *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)pfVar12 + uVar20 * 2 * 0x10))->_M_local_buf + 8) = uVar26;
            p_Var6 = (pfVar17->super__Function_base)._M_manager;
            (pfVar17->super__Function_base)._M_manager =
                 (_Manager_type)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pfVar12 + (uVar20 * 2 + 1) * 0x10))->_M_allocated_capacity;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + (uVar20 * 2 + 1) * 0x10))->_M_allocated_capacity =
                 (size_type)p_Var6;
            p_Var7 = pfVar17->_M_invoker;
            pfVar17->_M_invoker = *(_Invoker_type *)((long)pfVar12 + uVar20 * 0x20 + 0x18);
            *(_Invoker_type *)((long)pfVar12 + uVar20 * 0x20 + 0x18) = p_Var7;
            runner.txrequest.m_impl._M_t.
            super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
            .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
                 *(unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                   *)&pfVar17[1].super__Function_base._M_functor;
            runner.actions.
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 *(pointer *)((long)&pfVar17[1].super__Function_base._M_functor + 8);
            uVar26 = *(undefined8 *)
                      (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)pfVar12 + uVar33 * 2 * 0x10))->_M_local_buf + 8);
            *(size_type *)&pfVar17[1].super__Function_base._M_functor =
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pfVar12 + uVar33 * 2 * 0x10))->_M_allocated_capacity;
            *(undefined8 *)((long)&pfVar17[1].super__Function_base._M_functor + 8) = uVar26;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + uVar33 * 2 * 0x10))->_M_allocated_capacity =
                 (size_type)
                 runner.txrequest.m_impl._M_t.
                 super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                 .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl;
            *(pointer *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)pfVar12 + uVar33 * 2 * 0x10))->_M_local_buf + 8) =
                 runner.actions.
                 super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            p_Var6 = pfVar17[1].super__Function_base._M_manager;
            pfVar17[1].super__Function_base._M_manager =
                 (_Manager_type)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pfVar12 + (uVar33 * 2 + 1) * 0x10))->_M_allocated_capacity;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + (uVar33 * 2 + 1) * 0x10))->_M_allocated_capacity =
                 (size_type)p_Var6;
            p_Var7 = pfVar17[1]._M_invoker;
            pfVar17[1]._M_invoker = *(_Invoker_type *)((long)pfVar12 + uVar33 * 0x20 + 0x18);
            *(_Invoker_type *)((long)pfVar12 + uVar33 * 0x20 + 0x18) = p_Var7;
            lVar25 = lVar25 + 0x40;
            pfVar17 = pfVar17 + 2;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pfVar17 != paVar34);
        }
      }
      else {
        __d._M_param._M_a = 0;
        __d._M_param._M_b = 0xffffffffffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start != paVar18) {
          lVar25 = 0x20;
          do {
            local_168.m_message.px = (element_type *)(lVar25 >> 5);
            local_168._0_8_ = (undefined **)0x0;
            rVar19 = std::uniform_int_distribution<unsigned_long>::operator()
                               ((uniform_int_distribution<unsigned_long> *)&__d,__urng,
                                (param_type *)&local_168);
            p_Var1 = (__uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                      *)((long)pfVar12 + lVar25);
            runner.txrequest.m_impl._M_t.
            super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
            .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
                 *(unique_ptr<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                   *)&p_Var1->_M_t;
            runner.actions.
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&p_Var1[1]._M_t;
            _Var9._M_t.
            super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
            .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl =
                 *(tuple<TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_> *)
                  (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_local_buf + 8);
            p_Var1->_M_t = (tuple<TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                            )((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_allocated_capacity;
            p_Var1[1]._M_t =
                 _Var9._M_t.
                 super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                 .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_allocated_capacity =
                 (size_type)
                 runner.txrequest.m_impl._M_t.
                 super___uniq_ptr_impl<TxRequestTracker::Impl,_std::default_delete<TxRequestTracker::Impl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TxRequestTracker::Impl_*,_std::default_delete<TxRequestTracker::Impl>_>
                 .super__Head_base<0UL,_TxRequestTracker::Impl_*,_false>._M_head_impl;
            *(pointer *)
             (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)pfVar12 + rVar19 * 2 * 0x10))->_M_local_buf + 8) =
                 runner.actions.
                 super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            sVar5 = *(size_type *)((long)pfVar12 + lVar25 + 0x10);
            *(size_type *)((long)pfVar12 + lVar25 + 0x10) =
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pfVar12 + (rVar19 * 2 + 1) * 0x10))->_M_allocated_capacity;
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)pfVar12 + (rVar19 * 2 + 1) * 0x10))->_M_allocated_capacity = sVar5;
            uVar26 = *(undefined8 *)((long)pfVar12 + lVar25 + 0x18);
            *(undefined8 *)((long)pfVar12 + lVar25 + 0x18) =
                 *(undefined8 *)((long)pfVar12 + rVar19 * 0x20 + 0x18);
            *(undefined8 *)((long)pfVar12 + rVar19 * 0x20 + 0x18) = uVar26;
            paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)pfVar12 + lVar25);
            lVar25 = lVar25 + 0x20;
          } while (paVar35 != paVar18);
        }
      }
    }
    TxRequestTracker::TxRequestTracker(&runner.txrequest,false);
    unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&runner.actions;
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    runner.actions.
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &runner.expired._M_t._M_impl.super__Rb_tree_header._M_header;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.peerset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.txhashset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         runner.expired._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar21 = RandomMixin<FastRandomContext>::randbits
                       (&__urng->super_RandomMixin<FastRandomContext>,0x2d);
    bVar37 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pfVar12 != paVar34;
    paVar34 = &local_f8;
    if (bVar37) {
      do {
        uVar22 = RandomMixin<FastRandomContext>::randbits
                           (&__urng->super_RandomMixin<FastRandomContext>,0x17);
        uVar23 = RandomMixin<FastRandomContext>::randbits
                           (&__urng->super_RandomMixin<FastRandomContext>,0x17);
        uVar24 = RandomMixin<FastRandomContext>::randbits
                           (&__urng->super_RandomMixin<FastRandomContext>,0x17);
        local_110.__r = uVar24 + uVar23 + uVar22 + uVar21 + 4;
        __d._M_param._M_b = (unsigned_long)&runner;
        local_f8._M_local_buf[0] = '\0';
        __d._M_param._M_a = (unsigned_long)__urng;
        if (local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          pcVar36 = (char *)0x0;
          paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188.
                       super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if ((_Manager_type)paVar35[-1]._M_allocated_capacity == (_Manager_type)0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) goto LAB_006b4758;
              std::__throw_bad_function_call();
              goto LAB_006b442d;
            }
            (**(_Invoker_type *)((long)paVar35 + -8))((_Any_data *)(paVar35 + -2),(Scenario *)&__d);
            paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_188.
                                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -0x20);
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_188.
                                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -0x10);
            local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar35;
            if ((_Manager_type)paVar18->_M_allocated_capacity != (_Manager_type)0x0) {
              (*(_Manager_type)paVar18->_M_allocated_capacity)
                        ((_Any_data *)paVar35,(_Any_data *)paVar35,__destroy_functor);
            }
          } while ((paVar35 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188.
                       super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) &&
                  (uVar8 = (uint)pcVar36, pcVar36 = (char *)(ulong)(uVar8 + 1), uVar8 < 9));
        }
      } while (local_188.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_188.
               super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
    ppVar14 = runner.actions.
              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppVar13 = runner.actions.
              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar36 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    paVar34 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xf6912f;
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)runner.actions.
                 super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)runner.actions.
                 super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (runner.actions.
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        runner.actions.
        super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar25 = ((long)runner.actions.
                      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)runner.actions.
                      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      _GLOBAL__N_1::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                           *)&__d,(__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>
                                   )runner.actions.
                                    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                          (lVar25 - (lVar25 + 1 >> 0x3f)) + 1 >> 1);
      if ((undefined1 *)local_110.__r == (undefined1 *)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::TxRequestTest::TestInterleavedScenarios()::__7>>
                  (ppVar13,ppVar14);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::vector<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>>,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::TxRequestTest::TestInterleavedScenarios()::__7>>
                  (ppVar13,ppVar14,local_110.__r,__d._M_param._M_b);
      }
      _GLOBAL__N_1::std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_*,_std::vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>_>,_std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                  *)&__d);
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)runner.actions.
                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      paVar35 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)runner.actions.
                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; paVar18 != paVar35;
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar18->_M_local_buf + 0x28)) {
      if (*(_Invoker_type *)(paVar18->_M_local_buf + 0x18) == (_Invoker_type)0x0) goto LAB_006b442d;
      (**(code **)&(((pointer)(paVar18->_M_local_buf + 0x20))->super__Function_base)._M_functor)
                (paVar18->_M_local_buf + 8);
    }
    local_198 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_190 = "";
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x2e5;
    file.m_begin = (iterator)&local_198;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1a8,msg);
    local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
    local_1c8._0_8_ = &PTR__lazy_ostream_013abb30;
    local_1b8 = boost::unit_test::lazy_ostream::inst;
    local_1b0 = "";
    local_1d0 = TxRequestTracker::Size(&runner.txrequest);
    local_1d4 = 0;
    local_138 = (undefined1 *)CONCAT71(local_138._1_7_,local_1d0 == 0);
    local_130 = (element_type *)0x0;
    sStack_128.pi_ = (sp_counted_base *)0x0;
    local_148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_140 = "";
    local_1e8 = &local_1d0;
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_013abb70;
    local_170 = &local_1d4;
    local_168.m_message.px = (element_type *)((ulong)local_168.m_message.px & 0xffffffffffffff00);
    local_168._0_8_ = &PTR__lazy_ostream_013abbb0;
    local_168.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_150 = &local_170;
    pvVar31 = (iterator)0x1;
    pvVar32 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_138,(lazy_ostream *)local_1c8,1,2,REQUIRE,0xf6913e,
               (size_t)&local_148,0x2e5,&__d,"0U",&local_168);
    boost::detail::shared_count::~shared_count(&sStack_128);
    local_1c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
    ;
    local_1c8._8_8_ = "";
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    local_130 = (element_type *)&boost::unit_test::basic_cstring<char_const>::null;
    _cVar38 = 0x6b42d2;
    file_00.m_end = (iterator)0x2e6;
    file_00.m_begin = (iterator)local_1c8;
    msg_00.m_end = pvVar32;
    msg_00.m_begin = pvVar31;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_138,
               msg_00);
    local_168.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         (runner.expired._M_t._M_impl.super__Rb_tree_header._M_node_count == 0);
    local_168.m_message.px = (element_type *)0x0;
    local_168.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148 = "runner.expired.empty()";
    local_140 = "";
    __d._M_param._M_b = __d._M_param._M_b & 0xffffffffffffff00;
    __d._M_param._M_a = (unsigned_long)&PTR__lazy_ostream_013abc70;
    local_110.__r = (rep)boost::unit_test::lazy_ostream::inst;
    local_1e8 = (size_t *)0xf690c7;
    local_1e0 = "";
    in_RSI = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&__d;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_168,(lazy_ostream *)in_RSI,1,0,WARN,_cVar38,(size_t)&local_1e8,0x2e6);
    boost::detail::shared_count::~shared_count(&local_168.m_message.pn);
    _GLOBAL__N_1::std::
    _Rb_tree<std::pair<long,_GenTxid>,_std::pair<long,_GenTxid>,_std::_Identity<std::pair<long,_GenTxid>_>,_std::less<std::pair<long,_GenTxid>_>,_std::allocator<std::pair<long,_GenTxid>_>_>
    ::~_Rb_tree(&runner.expired._M_t);
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                 *)&runner.txhashset);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree((_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> *)
              &runner.peerset);
    _GLOBAL__N_1::std::
    vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ::~vector((vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               *)unaff_R12);
    TxRequestTracker::~TxRequestTracker(&runner.txrequest);
    _GLOBAL__N_1::std::
    vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ::~vector(&local_188);
    iVar29 = iVar29 + 1;
  } while (iVar29 != 5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
LAB_006b4758:
  __stack_chk_fail();
LAB_006b442d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    std::__throw_bad_function_call();
    paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__urng;
LAB_006b4449:
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar34;
    local_188.
    super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
      std::__throw_length_error("vector::_M_realloc_insert");
LAB_006b447c:
      local_188.
      super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar34;
      local_188.
      super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
        std::__throw_length_error("vector::_M_realloc_insert");
LAB_006b44af:
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar34;
        local_188.
        super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
          std::__throw_length_error("vector::_M_realloc_insert");
LAB_006b44e2:
          local_188.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar36;
          local_188.
          super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
            std::__throw_length_error("vector::_M_realloc_insert");
            in_RSI = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)pcVar36;
LAB_006b4515:
            local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)unaff_R12;
            local_188.
            super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)unaff_R12;
              std::__throw_length_error("vector::_M_realloc_insert");
LAB_006b4548:
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RSI;
              local_188.
              super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
                local_188.
                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RSI;
                std::__throw_length_error("vector::_M_realloc_insert");
LAB_006b457b:
                local_188.
                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar18;
                local_188.
                super__Vector_base<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar35;
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
                  uVar26 = std::__throw_length_error("vector::_M_realloc_insert");
                  _GLOBAL__N_1::std::
                  vector<std::function<void_((anonymous_namespace)::Scenario_&)>,_std::allocator<std::function<void_((anonymous_namespace)::Scenario_&)>_>_>
                  ::~vector(&local_188);
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
                    _Unwind_Resume(uVar26);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_006b4758;
}

Assistant:

BOOST_AUTO_TEST_CASE(TxRequestTest)
{
    for (int i = 0; i < 5; ++i) {
        TestInterleavedScenarios();
    }
}